

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_test_isset(MTBDD set)

{
  int iVar1;
  mtbddnode_t node;
  MTBDD MVar2;
  mtbddnode_t n;
  MTBDD set_local;
  
  n = (mtbddnode_t)set;
  while( true ) {
    if (n == (mtbddnode_t)0x8000000000000000) {
      return;
    }
    if (n == (mtbddnode_t)0x0) {
      __assert_fail("set != mtbdd_false",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                    ,0xddf,"void mtbdd_test_isset(MTBDD)");
    }
    iVar1 = llmsset_is_marked((llmsset_t_conflict)nodes,(uint64_t)n);
    if (iVar1 == 0) {
      __assert_fail("llmsset_is_marked(nodes, set)",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                    ,0xde0,"void mtbdd_test_isset(MTBDD)");
    }
    node = MTBDD_GETNODE((MTBDD)n);
    MVar2 = mtbddnode_followlow((MTBDD)n,node);
    if (MVar2 != 0) break;
    n = (mtbddnode_t)mtbddnode_followhigh((MTBDD)n,node);
  }
  __assert_fail("node_getlow(set, n) == mtbdd_false",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_mtbdd.c"
                ,0xde2,"void mtbdd_test_isset(MTBDD)");
}

Assistant:

void
mtbdd_test_isset(MTBDD set)
{
    while (set != mtbdd_true) {
        assert(set != mtbdd_false);
        assert(llmsset_is_marked(nodes, set));
        mtbddnode_t n = MTBDD_GETNODE(set);
        assert(node_getlow(set, n) == mtbdd_false);
        set = node_gethigh(set, n);
    }
}